

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# storefst.h
# Opt level: O1

void __thiscall PDA::Transducer::Grammar::Rule::addChains<wchar_t[2]>(Rule *this,wchar_t (*t) [2])

{
  anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
  *paVar1;
  size_t sVar2;
  Chain local_60;
  long *local_40;
  long local_38;
  long local_30 [2];
  
  local_40 = local_30;
  sVar2 = wcslen(*t);
  std::__cxx11::wstring::_M_construct<wchar_t_const*>((wstring *)&local_40,t,*t + sVar2);
  paVar1 = &local_60.m_chain.field_2;
  local_60.m_chain._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::wstring::_M_construct<wchar_t*>
            ((wstring *)&local_60,local_40,(long)local_40 + local_38 * 4);
  std::vector<PDA::Transducer::Grammar::Chain,_std::allocator<PDA::Transducer::Grammar::Chain>_>::
  emplace_back<PDA::Transducer::Grammar::Chain>(&this->m_chains,&local_60);
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_60.m_chain._M_dataplus._M_p != paVar1) {
    operator_delete(local_60.m_chain._M_dataplus._M_p,
                    local_60.m_chain.field_2._M_allocated_capacity * 4 + 4);
  }
  if (local_40 != local_30) {
    operator_delete(local_40,local_30[0] * 4 + 4);
  }
  return;
}

Assistant:

void addChains(const T &t)
        {
            m_chains.push_back(Chain(t));
        }